

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall
QPDF::checkHSharedObject
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *idx_to_obj)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  QPDFObjGen og_00;
  Members *pMVar2;
  int iVar3;
  int iVar4;
  const_reference this_00;
  reference this_01;
  size_type sVar5;
  qpdf_offset_t __val;
  mapped_type *pmVar6;
  unsigned_long __n;
  reference pvVar7;
  long __val_00;
  int __val_01;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  int local_150;
  int local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  Members *local_e8;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *local_e0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  QPDFObjGen og;
  string local_70;
  string local_50;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_d8 = idx_to_obj;
  if (*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14) <
      *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10)) {
    msg._M_str = "shared object hint table: ntotal < nfirst_page";
    msg._M_len = 0x2e;
    linearizationWarning(this,msg);
    return;
  }
  this_00 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(pages,0);
  local_150 = QPDFObjectHandle::getObjectID(this_00);
  local_e0 = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28);
  local_e8 = _Var1._M_head_impl;
  for (local_14c = 0; pMVar2 = local_e8, local_14c < (local_e8->shared_object_hints).nshared_total;
      local_14c = local_14c + 1) {
    if (local_14c == (local_e8->shared_object_hints).nshared_first_page) {
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      if (*(pointer *)
           &((_Var1._M_head_impl)->part8).
            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> ==
          *(pointer *)((long)&(_Var1._M_head_impl)->part8 + 8)) {
        msg_01._M_str = "part 8 is empty but nshared_total > nshared_first_page";
        msg_01._M_len = 0x36;
        linearizationWarning(this,msg_01);
      }
      else {
        this_01 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                            (&(_Var1._M_head_impl)->part8,0);
        iVar3 = QPDFObjectHandle::getObjectID(this_01);
        iVar4 = (pMVar2->shared_object_hints).first_shared_obj;
        if (iVar3 != iVar4) {
          std::__cxx11::to_string(&local_108,iVar4);
          std::operator+(&local_b0,"first shared object number mismatch: hint table = ",&local_108);
          std::operator+(&local_128,&local_b0,"; computed = ");
          std::__cxx11::to_string(&local_d0,iVar3);
          std::operator+(&local_148,&local_128,&local_d0);
          msg_00._M_str = local_148._M_dataplus._M_p;
          msg_00._M_len = local_148._M_string_length;
          linearizationWarning(this,msg_00);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_108);
        }
      }
      local_150 = (pMVar2->shared_object_hints).first_shared_obj;
      og.gen = 0;
      og.obj = local_150;
      sVar5 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count(&((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,&og
                     );
      if (sVar5 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"unknown object in shared object hint table",
                   (allocator<char> *)&local_128);
        stopOnError(this,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
      }
      og_00.gen = og.gen;
      og_00.obj = og.obj;
      __val = getLinearizationOffset(this,og_00);
      __val_00 = (pMVar2->shared_object_hints).first_shared_offset;
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      if (*(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->linp + 0x30) <= __val_00) {
        __val_00 = __val_00 + *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->linp + 0x38);
      }
      if (__val != __val_00) {
        std::__cxx11::to_string(&local_108,__val_00);
        std::operator+(&local_b0,"first shared object offset mismatch: hint table = ",&local_108);
        std::operator+(&local_128,&local_b0,"; computed = ");
        std::__cxx11::to_string(&local_d0,__val);
        std::operator+(&local_148,&local_128,&local_d0);
        msg_02._M_str = local_148._M_dataplus._M_p;
        msg_02._M_len = local_148._M_string_length;
        linearizationWarning(this,msg_02);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_108);
      }
    }
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](local_d8,&local_14c);
    *pmVar6 = local_150;
    __n = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_14c);
    pvVar7 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (local_e0,__n);
    iVar3 = pvVar7->nobjects_minus_one + 1;
    iVar4 = lengthNextN(this,local_150,iVar3);
    __val_01 = pvVar7->delta_group_length + (pMVar2->shared_object_hints).min_group_length;
    if (iVar4 != __val_01) {
      std::__cxx11::to_string((string *)&og,local_14c);
      std::operator+(&local_d0,"shared object ",(string *)&og);
      std::operator+(&local_108,&local_d0," length mismatch: hint table = ");
      std::__cxx11::to_string(&local_70,__val_01);
      std::operator+(&local_b0,&local_108,&local_70);
      std::operator+(&local_128,&local_b0,"; computed = ");
      std::__cxx11::to_string(&local_50,iVar4);
      std::operator+(&local_148,&local_128,&local_50);
      msg_03._M_str = local_148._M_dataplus._M_p;
      msg_03._M_len = local_148._M_string_length;
      linearizationWarning(this,msg_03);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&og);
    }
    local_150 = local_150 + iVar3;
  }
  return;
}

Assistant:

void
QPDF::checkHSharedObject(std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& idx_to_obj)
{
    // Implementation note 125 says shared object groups always contain only one object.
    // Implementation note 128 says that Acrobat always nbits_nobjects to zero.  Implementation note
    // 130 says that Acrobat does not support more than one shared object per group.  These are all
    // consistent.

    // Implementation note 129 states that MD5 signatures are not implemented in Acrobat, so
    // signature_present must always be zero.

    // Implementation note 131 states that first_shared_obj and first_shared_offset have meaningless
    // values for single-page files.

    // Empirically, Acrobat and pdlin generate incorrect values for these whenever there are no
    // shared objects not referenced by the first page (i.e., nshared_total == nshared_first_page).

    HSharedObject& so = m->shared_object_hints;
    if (so.nshared_total < so.nshared_first_page) {
        linearizationWarning("shared object hint table: ntotal < nfirst_page");
    } else {
        // The first nshared_first_page objects are consecutive objects starting with the first page
        // object.  The rest are consecutive starting from the first_shared_obj object.
        int cur_object = pages.at(0).getObjectID();
        for (int i = 0; i < so.nshared_total; ++i) {
            if (i == so.nshared_first_page) {
                QTC::TC("qpdf", "QPDF lin check shared past first page");
                if (m->part8.empty()) {
                    linearizationWarning("part 8 is empty but nshared_total > nshared_first_page");
                } else {
                    int obj = m->part8.at(0).getObjectID();
                    if (obj != so.first_shared_obj) {
                        linearizationWarning(
                            "first shared object number mismatch: hint table = " +
                            std::to_string(so.first_shared_obj) +
                            "; computed = " + std::to_string(obj));
                    }
                }

                cur_object = so.first_shared_obj;

                QPDFObjGen og(cur_object, 0);
                if (m->xref_table.count(og) == 0) {
                    stopOnError("unknown object in shared object hint table");
                }
                qpdf_offset_t offset = getLinearizationOffset(og);
                qpdf_offset_t h_offset = adjusted_offset(so.first_shared_offset);
                if (offset != h_offset) {
                    linearizationWarning(
                        "first shared object offset mismatch: hint table = " +
                        std::to_string(h_offset) + "; computed = " + std::to_string(offset));
                }
            }

            idx_to_obj[i] = cur_object;
            HSharedObjectEntry& se = so.entries.at(toS(i));
            int nobjects = se.nobjects_minus_one + 1;
            int length = lengthNextN(cur_object, nobjects);
            int h_length = so.min_group_length + se.delta_group_length;
            if (length != h_length) {
                linearizationWarning(
                    "shared object " + std::to_string(i) + " length mismatch: hint table = " +
                    std::to_string(h_length) + "; computed = " + std::to_string(length));
            }
            cur_object += nobjects;
        }
    }
}